

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

Ref cashew::ValueBuilder::makeTry(Ref try_,Ref arg,Ref catch_)

{
  char *pcVar1;
  char cVar2;
  Ref *pRVar3;
  Value *pVVar4;
  Ref RVar5;
  void *__ptr;
  Ref local_38;
  Ref try__local;
  Ref catch__local;
  
  local_38.inst = try_.inst;
  try__local = catch_;
  pRVar3 = (Ref *)cashew::Ref::operator[]((uint)&local_38);
  cVar2 = cashew::Ref::operator==(pRVar3,(IString *)&BLOCK);
  if (cVar2 == '\0') {
    __assert_fail("try_[0] == BLOCK",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                  ,0x6fd,"static Ref cashew::ValueBuilder::makeTry(Ref, Ref, Ref)");
  }
  pRVar3 = (Ref *)cashew::Ref::operator[]((uint)&try__local);
  cVar2 = cashew::Ref::operator==(pRVar3,(IString *)&BLOCK);
  if (cVar2 != '\0') {
    pVVar4 = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
    pVVar4->type = Null;
    pVVar4 = Value::setArray(pVVar4,3);
    __ptr = (void *)0x18;
    RVar5.inst = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
    (RVar5.inst)->type = Null;
    Value::free(RVar5.inst,__ptr);
    (RVar5.inst)->type = String;
    pcVar1 = ::wasm::ABI::wasm2js::MEMORY_FILL;
    ((RVar5.inst)->field_1).str.str._M_len = TRY;
    ((RVar5.inst)->field_1).str.str._M_str = pcVar1;
    pVVar4 = Value::push_back(pVVar4,RVar5);
    pVVar4 = Value::push_back(pVVar4,local_38);
    pVVar4 = Value::push_back(pVVar4,arg);
    RVar5.inst = Value::push_back(pVVar4,try__local);
    return (Ref)RVar5.inst;
  }
  __assert_fail("catch_[0] == BLOCK",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x6fe,"static Ref cashew::ValueBuilder::makeTry(Ref, Ref, Ref)");
}

Assistant:

static Ref makeTry(Ref try_, Ref arg, Ref catch_) {
    assert(try_[0] == BLOCK);
    assert(catch_[0] == BLOCK);
    return &makeRawArray(3)
              ->push_back(makeRawString(TRY))
              .push_back(try_)
              .push_back(arg)
              .push_back(catch_);
  }